

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  uint8_t uVar1;
  int iVar2;
  int local_44;
  uint8_t type;
  int ret;
  ptls_handshake_properties_t *properties_local;
  int is_end_of_record_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  if (((byte)tls->field_0x160 >> 5 & 1) != 0) {
    iVar2 = server_handle_hello(tls,emitter,message,properties);
    return iVar2;
  }
  uVar1 = *message.base;
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if ((uVar1 == '\x02') && (is_end_of_record != 0)) {
      local_44 = client_handle_hello(tls,emitter,message,properties);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (uVar1 == '\b') {
      local_44 = client_handle_encrypted_extensions(tls,message,properties);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (uVar1 == '\r') {
      iVar2 = client_handle_certificate_request(tls,message,properties);
      return iVar2;
    }
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (uVar1 == '\v') {
      local_44 = client_handle_certificate(tls,message);
    }
    else if (uVar1 == '\x19') {
      local_44 = client_handle_compressed_certificate(tls,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (uVar1 == '\x0f') {
      local_44 = client_handle_certificate_verify(tls,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if ((uVar1 == '\x14') && (is_end_of_record != 0)) {
      local_44 = client_handle_finished(tls,emitter,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    if ((uVar1 == '\x01') && (is_end_of_record != 0)) {
      local_44 = server_handle_hello(tls,emitter,message,properties);
    }
    else {
      local_44 = 0x28;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    if (uVar1 == '\v') {
      local_44 = server_handle_certificate(tls,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (uVar1 == '\x0f') {
      local_44 = server_handle_certificate_verify(tls,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if (((byte)tls->ctx->field_0x68 >> 4 & 1) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x1117,
                    "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (uVar1 == '\x05') {
      local_44 = server_handle_end_of_early_data(tls,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if ((uVar1 == '\x14') && (is_end_of_record != 0)) {
      local_44 = server_handle_finished(tls,message);
    }
    else {
      local_44 = 0x28;
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (uVar1 == '\x04') {
      local_44 = client_handle_new_session_ticket(tls,message);
    }
    else if (uVar1 == '\x18') {
      local_44 = handle_key_update(tls,emitter,message);
    }
    else {
      local_44 = 10;
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    if (uVar1 == '\x18') {
      local_44 = handle_key_update(tls,emitter,message);
    }
    else {
      local_44 = 10;
    }
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x113d,
                  "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  return local_44;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                    ptls_handshake_properties_t *properties)
{
    int ret;
    if (tls->in_handshake)
        return(server_handle_hello(tls, emitter, message, properties));
    uint8_t type = message.base[0];

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}